

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O0

Directory * __thiscall CompoundFile::File::directory(File *this,wstring *name)

{
  bool bVar1;
  __type _Var2;
  pointer ppVar3;
  undefined8 uVar4;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RSI;
  Directory *in_RDI;
  const_iterator last;
  const_iterator it;
  Directory *in_stack_ffffffffffffff58;
  Directory *in_stack_ffffffffffffff60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__rhs;
  Directory *this_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_69 [65];
  _Self local_28;
  _Self local_20 [4];
  
  this_00 = in_RDI;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
       ::begin((map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
                *)in_stack_ffffffffffffff58);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
       ::end((map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
              *)in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = std::operator!=(local_20,&local_28);
    if (!bVar1) {
      uVar4 = __cxa_allocate_exception(0x30);
      __rhs = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_69
      ;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring
                ((wstring *)(local_69 + 1),L"There is no such directory : ",(allocator *)__rhs);
      std::operator+(&in_RDI->m_name,__rhs);
      Exception::Exception((Exception *)this_00,&in_RDI->m_name);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_CompoundFile::Directory>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_int,_CompoundFile::Directory>_> *)
                        0x12858e);
    Directory::name_abi_cxx11_(&ppVar3->second);
    _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RSI)
    ;
    if (_Var2) break;
    std::_Rb_tree_const_iterator<std::pair<const_int,_CompoundFile::Directory>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_CompoundFile::Directory>_> *)
               in_stack_ffffffffffffff60);
  }
  std::_Rb_tree_const_iterator<std::pair<const_int,_CompoundFile::Directory>_>::operator->
            ((_Rb_tree_const_iterator<std::pair<const_int,_CompoundFile::Directory>_> *)0x1285bd);
  Directory::Directory(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return this_00;
}

Assistant:

inline Directory
File::directory( const std::wstring & name ) const
{
	for( std::map< int32_t, Directory >::const_iterator it = m_dirs.begin(),
		last = m_dirs.end(); it != last; ++it )
	{
		if( it->second.name() == name )
			return it->second;
	}

	throw Exception( std::wstring( L"There is no such directory : " ) + name );
}